

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  json_str jsonStr;
  
  jsonStr.value.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello",&local_59);
  str_value_of((json_str *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  json_str::str_value_abi_cxx11_(&local_90,(json_str *)local_38);
  this = std::operator<<((ostream *)&std::cout,(string *)&local_90);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  jsonStr.value.field_2._12_4_ = 0;
  json_str::~json_str((json_str *)local_38);
  return jsonStr.value.field_2._12_4_;
}

Assistant:

int main() {
    json_str jsonStr = str_value_of("hello");
    cout << jsonStr.str_value() << endl;
    return 0;
}